

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<TFad<6,_double>_>::Decompose_LU(TPZMatrix<TFad<6,_double>_> *this)

{
  byte bVar1;
  TFad<6,_double> *rhs;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int64_t j;
  long lVar6;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_1d0;
  TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_1c0;
  TFad<6,_double> local_1b0;
  TFad<6,_double> local_170;
  TFad<6,_double> local_130;
  TFad<6,_double> local_f0;
  TFad<6,_double> local_b0;
  TFad<6,_double> local_70;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (1 < bVar1) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (bVar1 == 0) {
    local_b0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
    local_b0.val_ = 0.0;
    local_b0.dx_[0] = 0.0;
    local_b0.dx_[5] = 0.0;
    local_b0.dx_[1] = 0.0;
    local_b0.dx_[2] = 0.0;
    local_b0.dx_[3] = 0.0;
    local_b0.dx_[4] = 0.0;
    local_f0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
    local_f0.val_ = 0.0;
    local_f0.dx_[0] = 0.0;
    local_f0.dx_[5] = 0.0;
    local_f0.dx_[1] = 0.0;
    local_f0.dx_[2] = 0.0;
    local_f0.dx_[3] = 0.0;
    local_f0.dx_[4] = 0.0;
    lVar2 = (this->super_TPZBaseMatrix).fRow;
    lVar3 = (this->super_TPZBaseMatrix).fCol;
    if (lVar3 < lVar2) {
      lVar2 = lVar3;
    }
    lVar3 = 0;
    if (lVar2 < 1) {
      lVar2 = lVar3;
    }
    while (lVar4 = lVar3, lVar4 != lVar2) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_170,this,lVar4,lVar4);
      rhs = TFad<6,_double>::operator=(&local_f0,&local_170);
      TFad<6,_double>::TFad(&local_130,rhs);
      local_130.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
      if (ABS(local_130.val_) < 1e-12) {
        Error("Decompose_LU <matrix is singular>",(char *)0x0);
      }
      lVar3 = lVar4 + 1;
      lVar5 = lVar3;
      while( true ) {
        if ((this->super_TPZBaseMatrix).fRow <= lVar5) break;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_170,this,lVar5,lVar4);
        local_1b0.val_ = (double)&local_f0;
        local_1b0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&local_170;
        TFad<6,double>::operator=
                  ((TFad<6,double> *)&local_b0,
                   (TFadExpr<TFadBinaryDiv<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_1b0);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar5,lVar4,&local_b0);
        for (lVar6 = lVar3; lVar6 < (this->super_TPZBaseMatrix).fCol; lVar6 = lVar6 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_1b0,this,lVar5,lVar6);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_70,this,lVar4,lVar6);
          local_1d0.fadexpr_.left_ = &local_b0;
          local_1c0.fadexpr_.left_ = &local_1b0;
          local_1c0.fadexpr_.right_ = &local_1d0;
          local_1d0.fadexpr_.right_ = &local_70;
          TFad<6,double>::
          TFad<TFadBinaryMinus<TFad<6,double>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>
                    ((TFad<6,double> *)&local_170,&local_1c0);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar5,lVar6,&local_170);
        }
        lVar5 = lVar5 + 1;
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}